

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderBlitting.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderBlittingNonLayeredToLayered::setUpFramebuffersForRendering
          (GeometryShaderBlittingNonLayeredToLayered *this,GLuint fbo_draw_id,GLuint fbo_read_id,
          GLint to_draw,GLint to_read)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_GeometryShaderBlitting).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x78))(0x8ca8,fbo_read_id);
  (**(code **)(lVar2 + 0x78))(0x8ca9,fbo_draw_id);
  (**(code **)(lVar2 + 0x6b8))(0x8ca8,0x8ce0,to_read,0,0);
  (**(code **)(lVar2 + 0x690))(0x8ca9,0x8ce0,to_draw,0);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"Error setting up FBOs setUpFramebuffersForRendering",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderBlitting.cpp"
                  ,0x145);
  return;
}

Assistant:

void GeometryShaderBlittingNonLayeredToLayered::setUpFramebuffersForRendering(glw::GLuint fbo_draw_id,
																			  glw::GLuint fbo_read_id,
																			  glw::GLint to_draw, glw::GLint to_read)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind framebuffers */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, fbo_read_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, fbo_draw_id);

	/*  Blitting from a non-layered read framebuffer to a layered draw framebuffer */
	gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, to_read, 0, 0);
	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, to_draw, 0 /* level */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting up FBOs setUpFramebuffersForRendering");
}